

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_Internal_ExtrudedEdge * __thiscall
ON_SimpleArray<ON_Internal_ExtrudedEdge>::AppendNew(ON_SimpleArray<ON_Internal_ExtrudedEdge> *this)

{
  int iVar1;
  int new_capacity;
  ON_SimpleArray<ON_Internal_ExtrudedEdge> *this_local;
  
  if (this->m_count == this->m_capacity) {
    iVar1 = NewCapacity(this);
    Reserve(this,(long)iVar1);
  }
  memset(this->m_a + this->m_count,0,0x40);
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  return this->m_a + iVar1;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}